

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousemanager.cpp
# Opt level: O3

void __thiscall QEvdevMouseManager::addMouse(QEvdevMouseManager *this,QString *deviceNode)

{
  void **ppvVar1;
  QLoggingCategory *pQVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  void **local_88;
  QObject local_80 [8];
  code *local_78;
  ImplFn local_70;
  QObject local_68 [8];
  void **local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivateLogging::qLcEvdevMouse();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar2->name;
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 0;
    uVar3 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"Adding mouse at %ls",uVar3);
  }
  local_60 = (void **)&DAT_aaaaaaaaaaaaaaaa;
  QEvdevMouseHandler::create((QEvdevMouseHandler *)&local_60,deviceNode,&this->m_spec);
  ppvVar1 = local_60;
  if (local_60 == (void **)0x0) {
    addMouse();
  }
  else {
    local_78 = handleMouseEvent;
    local_70 = (ImplFn)0x0;
    local_58 = 0x1282a2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<void_(QEvdevMouseManager::*)(int,_int,_bool,_QFlags<Qt::MouseButton>,_Qt::MouseButton,_QEvent::Type),_QtPrivate::List<int,_int,_bool,_QFlags<Qt::MouseButton>,_Qt::MouseButton,_QEvent::Type>,_void>
         ::impl;
    *(code **)(puVar4 + 4) = handleMouseEvent;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_68,ppvVar1,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)&local_78,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    ppvVar1 = local_60;
    local_78 = handleWheelEvent;
    local_70 = (ImplFn)0x0;
    local_58 = 0x128330;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<void_(QEvdevMouseManager::*)(QPoint),_QtPrivate::List<QPoint>,_void>::impl;
    *(code **)(puVar4 + 4) = handleWheelEvent;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_80,ppvVar1,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)&local_78,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    local_88 = local_60;
    local_60 = (void **)0x0;
    QtInputSupport::DeviceHandlerList<QEvdevMouseHandler>::add
              (&this->m_mice,deviceNode,
               (unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)&local_88);
    if (local_88 != (void **)0x0) {
      (**(code **)((long)*local_88 + 0x20))();
    }
    local_88 = (void **)0x0;
    lVar5 = QGuiApplicationPrivate::inputDeviceManager();
    QInputDeviceManagerPrivate::setDeviceCount((DeviceType)*(undefined8 *)(lVar5 + 8),1);
  }
  if (local_60 != (void **)0x0) {
    (**(code **)((long)*local_60 + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevMouseManager::addMouse(const QString &deviceNode)
{
    qCDebug(qLcEvdevMouse, "Adding mouse at %ls", qUtf16Printable(deviceNode));
    auto handler = QEvdevMouseHandler::create(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevMouseHandler::handleMouseEvent,
                this, &QEvdevMouseManager::handleMouseEvent);
        connect(handler.get(), &QEvdevMouseHandler::handleWheelEvent,
                this, &QEvdevMouseManager::handleWheelEvent);
        m_mice.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevmouse: Failed to open mouse device %ls", qUtf16Printable(deviceNode));
    }
}